

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

void __thiscall
SSTable::toSSTable(SSTable *this,SkipList *memTable,string *fileName,uint64_t timeStamp)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  runtime_error *this_00;
  unsigned_long n;
  uint64_t n_00;
  uint64_t n_01;
  uint64_t *puVar5;
  long lVar6;
  void *__buf;
  uint32_t local_2a9c;
  ConstIterator CStack_2a98;
  uint32_t offset;
  ConstIterator i;
  BloomFilter bloomFilter;
  uint64_t max;
  uint64_t min;
  unsigned_long length;
  char local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [48];
  ofstream local_220 [8];
  ofstream out;
  uint64_t timeStamp_local;
  string *fileName_local;
  SkipList *memTable_local;
  
  _Var3 = std::operator|(_S_out,_S_bin);
  _Var3 = std::operator|(_Var3,_S_trunc);
  std::ofstream::ofstream(local_220,(string *)memTable,_Var3);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    n = SkipList::getLength((SkipList *)this);
    n_00 = SkipList::getMinKey((SkipList *)this);
    n_01 = SkipList::getMaxKey((SkipList *)this);
    write64(local_220,(uint64_t)fileName);
    write64(local_220,n);
    write64(local_220,n_00);
    write64(local_220,n_01);
    BloomFilter::BloomFilter((BloomFilter *)&i,(SkipList *)this);
    BloomFilter::write((BloomFilter *)&i,(int)local_220,__buf,timeStamp);
    CStack_2a98 = SkipList::constBegin((SkipList *)this);
    local_2a9c = 0;
    while( true ) {
      bVar2 = SkipList::ConstIterator::hasNext(&stack0xffffffffffffd568);
      if (!bVar2) break;
      SkipList::ConstIterator::next(&stack0xffffffffffffd568);
      puVar5 = SkipList::ConstIterator::key(&stack0xffffffffffffd568);
      write64(local_220,*puVar5);
      write32(local_220,local_2a9c);
      SkipList::ConstIterator::value_abi_cxx11_(&stack0xffffffffffffd568);
      iVar4 = std::__cxx11::string::size();
      local_2a9c = local_2a9c + iVar4;
    }
    write64(local_220,0);
    write32(local_220,local_2a9c);
    CStack_2a98 = SkipList::constBegin((SkipList *)this);
    while( true ) {
      bVar2 = SkipList::ConstIterator::hasNext(&stack0xffffffffffffd568);
      if (!bVar2) break;
      SkipList::ConstIterator::next(&stack0xffffffffffffd568);
      SkipList::ConstIterator::value_abi_cxx11_(&stack0xffffffffffffd568);
      lVar6 = std::__cxx11::string::c_str();
      SkipList::ConstIterator::value_abi_cxx11_(&stack0xffffffffffffd568);
      std::__cxx11::string::size();
      std::ostream::write((char *)local_220,lVar6);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(local_220);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(local_270,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "toSSTable(SkipList): open file ");
  std::operator+(local_250,local_270);
  std::runtime_error::runtime_error(this_00,(string *)local_250);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SSTable::toSSTable(const SkipList &memTable, const string &fileName,
                        uint64_t timeStamp) {
  ofstream out(fileName, ios::out | ios::binary | ios::trunc);
  if (out.fail())
    throw runtime_error("toSSTable(SkipList): open file " + fileName +
                        " failed!");

  auto length = memTable.getLength();
  auto min = memTable.getMinKey();
  auto max = memTable.getMaxKey();

  // Header
  write64(out, timeStamp);
  write64(out, length);
  write64(out, min);
  write64(out, max);

  // Bloom Filter
  BloomFilter bloomFilter(memTable);
  bloomFilter.write(out);

  // Key, Offset
  auto i = memTable.constBegin();
  uint32_t offset = 0;
  while (i.hasNext()) {
    i.next();
    write64(out, i.key());
    write32(out, offset);
    offset += i.value().size();
  }
  write64(out, 0);
  write32(out, offset);

  // Value
  i = memTable.constBegin();
  while (i.hasNext()) {
    i.next();
    out.write(i.value().c_str(), i.value().size());
  }

  out.close();
}